

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

void dump_FMfield_as_XML(FMContext c,FMFormat_conflict format,int field,void *data,void *string_base
                        ,int encode,int verbose)

{
  ffs_dstring ds;
  
  ds = new_dstring();
  generic_field_to_XML(format,field,data,string_base,encode,ds);
  printf("%s",ds->string);
  free(ds->string);
  free(ds);
  return;
}

Assistant:

extern void
dump_FMfield_as_XML(FMContext c, FMFormat format, int field, void *data,
		    void *string_base, int encode, int verbose)
{
    ffs_dstring ds = new_dstring();
    generic_field_to_XML(format, field, data, string_base, encode,
			 ds);
    printf("%s", ds->string);
    free(ds->string);
    free(ds);
}